

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O1

void vkt::memory::anon_unknown_0::populateTestGroup(TestCaseGroup *group)

{
  char *__s;
  TestContext *testCtx;
  TestNode *pTVar1;
  TestNode *pTVar2;
  size_t sVar3;
  char *__end;
  pointer pcVar4;
  int iVar5;
  long lVar6;
  ostringstream caseName;
  undefined1 auStack_218 [15];
  undefined1 local_209;
  string local_208;
  TestNode *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  long local_1c0;
  ulong local_1b8;
  uint *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  pTVar1 = (TestNode *)operator_new(0x70);
  local_1e8 = &group->super_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(group->super_TestNode).m_testCtx,"buffer","");
  lVar6 = 8;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,*(char **)((long)&DAT_00d28b60 + lVar6),
               (allocator<char> *)local_1e0);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"","");
    pTVar2 = (TestNode *)
             createFunctionCase<unsigned_int>
                       (pTVar1->m_testCtx,NODETYPE_SELF_VALIDATE,local_1a8,&local_208,testBuffer,
                        *(uint *)(&UNK_00d28b58 + lVar6));
    tcu::TestNode::addChild(pTVar1,pTVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    pTVar2 = local_1e8;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x58);
  tcu::TestNode::addChild(local_1e8,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,pTVar2->m_testCtx,"image","");
  lVar6 = 0;
  local_1b8 = 0x100000002;
  do {
    local_1b0 = &DAT_00d28bb0 + lVar6 * 4;
    iVar5 = 1;
    local_1c0 = lVar6;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pcVar4 = (pointer)(ulong)*local_1b0;
      local_209 = (undefined1)local_1b0[1];
      __s = *(char **)(local_1b0 + 2);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_218 +
                        (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x70);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
      }
      if (iVar5 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"_tiling_linear",0xe);
        pcVar4 = (pointer)((ulong)pcVar4 | 0x100000000);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"_tiling_optimal",0xf);
      }
      if (((ulong)pcVar4 & 0x100000002) != local_1b8) {
        std::__cxx11::stringbuf::str();
        local_1e0[0] = local_1d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"");
        testCtx = pTVar1->m_testCtx;
        pTVar2 = (TestNode *)operator_new(0x90);
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar2,testCtx,NODETYPE_SELF_VALIDATE,local_208._M_dataplus._M_p,
                   (char *)local_1e0[0]);
        pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d28c20;
        pTVar2[1].m_testCtx = (TestContext *)testImage;
        pTVar2[1].m_name._M_dataplus._M_p = pcVar4;
        *(undefined1 *)&pTVar2[1].m_name._M_string_length = local_209;
        tcu::TestNode::addChild(pTVar1,pTVar2);
        if (local_1e0[0] != local_1d0) {
          operator_delete(local_1e0[0],local_1d0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      iVar5 = iVar5 + -1;
    } while (iVar5 == 0);
    lVar6 = local_1c0 + 1;
  } while (lVar6 != 6);
  tcu::TestNode::addChild(local_1e8,pTVar1);
  return;
}

Assistant:

void populateTestGroup (tcu::TestCaseGroup* group)
{
	// Buffers
	{
		const struct
		{
			VkBufferCreateFlags		flags;
			const char* const		name;
		} bufferCases[] =
		{
			{ (VkBufferCreateFlags)0,																								"regular"					},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT,																					"sparse"					},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT | VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT,											"sparse_residency"			},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT											| VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,	"sparse_aliased"			},
			{ VK_BUFFER_CREATE_SPARSE_BINDING_BIT | VK_BUFFER_CREATE_SPARSE_RESIDENCY_BIT	| VK_BUFFER_CREATE_SPARSE_ALIASED_BIT,	"sparse_residency_aliased"	},
		};

		de::MovePtr<tcu::TestCaseGroup> bufferGroup(new tcu::TestCaseGroup(group->getTestContext(), "buffer", ""));

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bufferCases); ++ndx)
			addFunctionCase(bufferGroup.get(), bufferCases[ndx].name, "", testBuffer, bufferCases[ndx].flags);

		group->addChild(bufferGroup.release());
	}

	// Images
	{
		const struct
		{
			VkImageCreateFlags		flags;
			bool					transient;
			const char* const		name;
		} imageFlagsCases[] =
		{
			{ (VkImageCreateFlags)0,																								false,	"regular"					},
			{ (VkImageCreateFlags)0,																								true,	"transient"					},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT,																					false,	"sparse"					},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT,											false,	"sparse_residency"			},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT											| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT,	false,	"sparse_aliased"			},
			{ VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT		| VK_IMAGE_CREATE_SPARSE_ALIASED_BIT,	false,	"sparse_residency_aliased"	},
		};

		de::MovePtr<tcu::TestCaseGroup> imageGroup(new tcu::TestCaseGroup(group->getTestContext(), "image", ""));

		for (int flagsNdx = 0; flagsNdx < DE_LENGTH_OF_ARRAY(imageFlagsCases); ++flagsNdx)
		for (int tilingNdx = 0; tilingNdx <= 1; ++tilingNdx)
		{
			ImageParams			params;
			std::ostringstream	caseName;

			params.flags		=  imageFlagsCases[flagsNdx].flags;
			params.transient	=  imageFlagsCases[flagsNdx].transient;
			caseName			<< imageFlagsCases[flagsNdx].name;

			if (tilingNdx != 0)
			{
				params.tiling =  VK_IMAGE_TILING_OPTIMAL;
				caseName      << "_tiling_optimal";
			}
			else
			{
				params.tiling =  VK_IMAGE_TILING_LINEAR;
				caseName      << "_tiling_linear";
			}

			if ((params.flags & VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT) && (params.tiling == VK_IMAGE_TILING_LINEAR))
				continue;

			addFunctionCase(imageGroup.get(), caseName.str(), "", testImage, params);
		}

		group->addChild(imageGroup.release());
	}
}